

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spgmr.c
# Opt level: O0

SUNLinearSolver SUNLinSol_SPGMR(N_Vector y,int pretype,int maxl,SUNContext sunctx)

{
  N_Vector w;
  N_Vector p_Var1;
  SUNContext p_Var2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  SUNLinearSolverContent_SPGMR content;
  SUNLinearSolver S;
  SUNLinearSolver in_stack_ffffffffffffffc8;
  int local_18;
  int local_14;
  SUNLinearSolver local_8;
  
  local_14 = in_ESI;
  if ((((in_ESI != 0) && (in_ESI != 1)) && (in_ESI != 2)) && (in_ESI != 3)) {
    local_14 = 0;
  }
  local_18 = in_EDX;
  if (in_EDX < 1) {
    local_18 = 5;
  }
  if (((((*(long *)(*(long *)(in_RDI + 8) + 8) == 0) ||
        (*(long *)(*(long *)(in_RDI + 8) + 0x18) == 0)) ||
       ((*(long *)(*(long *)(in_RDI + 8) + 0x50) == 0 ||
        ((*(long *)(*(long *)(in_RDI + 8) + 0x58) == 0 ||
         (*(long *)(*(long *)(in_RDI + 8) + 0x60) == 0)))))) ||
      (*(long *)(*(long *)(in_RDI + 8) + 0x68) == 0)) ||
     ((*(long *)(*(long *)(in_RDI + 8) + 0x70) == 0 ||
      (*(long *)(*(long *)(in_RDI + 8) + 0x90) == 0)))) {
    local_8 = (SUNLinearSolver)0x0;
  }
  else {
    local_8 = SUNLinSolNewEmpty((SUNContext)0x0);
    if (local_8 == (SUNLinearSolver)0x0) {
      local_8 = (SUNLinearSolver)0x0;
    }
    else {
      local_8->ops->gettype = SUNLinSolGetType_SPGMR;
      local_8->ops->getid = SUNLinSolGetID_SPGMR;
      local_8->ops->setatimes = SUNLinSolSetATimes_SPGMR;
      local_8->ops->setpreconditioner = SUNLinSolSetPreconditioner_SPGMR;
      local_8->ops->setscalingvectors = SUNLinSolSetScalingVectors_SPGMR;
      local_8->ops->setzeroguess = SUNLinSolSetZeroGuess_SPGMR;
      local_8->ops->initialize = SUNLinSolInitialize_SPGMR;
      local_8->ops->setup = SUNLinSolSetup_SPGMR;
      local_8->ops->solve = SUNLinSolSolve_SPGMR;
      local_8->ops->numiters = SUNLinSolNumIters_SPGMR;
      local_8->ops->resnorm = SUNLinSolResNorm_SPGMR;
      local_8->ops->resid = SUNLinSolResid_SPGMR;
      local_8->ops->lastflag = SUNLinSolLastFlag_SPGMR;
      local_8->ops->space = SUNLinSolSpace_SPGMR;
      local_8->ops->free = SUNLinSolFree_SPGMR;
      w = (N_Vector)malloc(0xb0);
      if (w == (N_Vector)0x0) {
        SUNLinSolFree(in_stack_ffffffffffffffc8);
        local_8 = (SUNLinearSolver)0x0;
      }
      else {
        local_8->content = w;
        *(undefined4 *)&w[1].ops = 0;
        *(int *)&w->content = local_18;
        *(int *)((long)&w->content + 4) = local_14;
        *(undefined4 *)&w->ops = 1;
        *(undefined4 *)((long)&w->ops + 4) = 0;
        *(undefined4 *)&w->sunctx = 0;
        *(undefined4 *)((long)&w->sunctx + 4) = 0;
        w[1].content = (void *)0x0;
        w[5].content = (void *)0x0;
        w[5].sunctx = (SUNContext)0x0;
        w[3].ops = (N_Vector_Ops)0x0;
        w[3].sunctx = (SUNContext)0x0;
        w[1].sunctx = (SUNContext)0x0;
        w[2].content = (void *)0x0;
        w[2].ops = (N_Vector_Ops)0x0;
        w[2].sunctx = (SUNContext)0x0;
        w[3].content = (void *)0x0;
        w[4].content = (void *)0x0;
        w[4].ops = (N_Vector_Ops)0x0;
        w[4].sunctx = (SUNContext)0x0;
        w[5].ops = (N_Vector_Ops)0x0;
        w[6].content = (void *)0x0;
        w[6].ops = (N_Vector_Ops)0x0;
        *(undefined4 *)&w[6].sunctx = 0;
        w[7].content = _stdout;
        p_Var1 = N_VClone(w);
        w[5].content = p_Var1;
        if (w[5].content == (void *)0x0) {
          SUNLinSolFree(in_stack_ffffffffffffffc8);
          local_8 = (SUNLinearSolver)0x0;
        }
        else {
          p_Var2 = (SUNContext)N_VClone(w);
          w[5].sunctx = p_Var2;
          if (w[5].sunctx == (SUNContext)0x0) {
            SUNLinSolFree(in_stack_ffffffffffffffc8);
            local_8 = (SUNLinearSolver)0x0;
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

SUNLinearSolver SUNLinSol_SPGMR(N_Vector y, int pretype, int maxl, SUNContext sunctx)
{
  SUNLinearSolver S;
  SUNLinearSolverContent_SPGMR content;

  /* check for legal pretype and maxl values; if illegal use defaults */
  if ((pretype != SUN_PREC_NONE)  && (pretype != SUN_PREC_LEFT) &&
      (pretype != SUN_PREC_RIGHT) && (pretype != SUN_PREC_BOTH))
    pretype = SUN_PREC_NONE;
  if (maxl <= 0)
    maxl = SUNSPGMR_MAXL_DEFAULT;

  /* check that the supplied N_Vector supports all requisite operations */
  if ( (y->ops->nvclone == NULL) || (y->ops->nvdestroy == NULL) ||
       (y->ops->nvlinearsum == NULL) || (y->ops->nvconst == NULL) ||
       (y->ops->nvprod == NULL) || (y->ops->nvdiv == NULL) ||
       (y->ops->nvscale == NULL) || (y->ops->nvdotprod == NULL) )
    return(NULL);

  /* Create linear solver */
  S = NULL;
  S = SUNLinSolNewEmpty(sunctx);
  if (S == NULL) return(NULL);

  /* Attach operations */
  S->ops->gettype           = SUNLinSolGetType_SPGMR;
  S->ops->getid             = SUNLinSolGetID_SPGMR;
  S->ops->setatimes         = SUNLinSolSetATimes_SPGMR;
  S->ops->setpreconditioner = SUNLinSolSetPreconditioner_SPGMR;
  S->ops->setscalingvectors = SUNLinSolSetScalingVectors_SPGMR;
  S->ops->setzeroguess      = SUNLinSolSetZeroGuess_SPGMR;
  S->ops->initialize        = SUNLinSolInitialize_SPGMR;
  S->ops->setup             = SUNLinSolSetup_SPGMR;
  S->ops->solve             = SUNLinSolSolve_SPGMR;
  S->ops->numiters          = SUNLinSolNumIters_SPGMR;
  S->ops->resnorm           = SUNLinSolResNorm_SPGMR;
  S->ops->resid             = SUNLinSolResid_SPGMR;
  S->ops->lastflag          = SUNLinSolLastFlag_SPGMR;
  S->ops->space             = SUNLinSolSpace_SPGMR;
  S->ops->free              = SUNLinSolFree_SPGMR;

  /* Create content */
  content = NULL;
  content = (SUNLinearSolverContent_SPGMR) malloc(sizeof *content);
  if (content == NULL) { SUNLinSolFree(S); return(NULL); }

  /* Attach content */
  S->content = content;

  /* Fill content */
  content->last_flag    = 0;
  content->maxl         = maxl;
  content->pretype      = pretype;
  content->gstype       = SUNSPGMR_GSTYPE_DEFAULT;
  content->max_restarts = SUNSPGMR_MAXRS_DEFAULT;
  content->zeroguess    = SUNFALSE;
  content->numiters     = 0;
  content->resnorm      = ZERO;
  content->xcor         = NULL;
  content->vtemp        = NULL;
  content->s1           = NULL;
  content->s2           = NULL;
  content->ATimes       = NULL;
  content->ATData       = NULL;
  content->Psetup       = NULL;
  content->Psolve       = NULL;
  content->PData        = NULL;
  content->V            = NULL;
  content->Hes          = NULL;
  content->givens       = NULL;
  content->yg           = NULL;
  content->cv           = NULL;
  content->Xv           = NULL;
  content->print_level  = 0;
  content->info_file    = stdout;
#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  content->info_file    = (sunctx->logger->info_fp) ? sunctx->logger->info_fp : stdout;
#endif

  /* Allocate content */
  content->xcor = N_VClone(y);
  if (content->xcor == NULL) { SUNLinSolFree(S); return(NULL); }

  content->vtemp = N_VClone(y);
  if (content->vtemp == NULL) { SUNLinSolFree(S); return(NULL); }

  return(S);
}